

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
::
add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>&>
          (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
           *this,node_type type,byte *args,basic_art_key<unsigned_long> *args_1,
          span<const_std::byte,_18446744073709551615UL> *args_2,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *args_3,
          tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *args_4,
          read_critical_section *args_5,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **args_6,read_critical_section *args_7,
          unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          *args_8)

{
  undefined7 in_register_00000031;
  _Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  _Var1;
  value_view v;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  tree_depth<unodb::detail::basic_art_key<unsigned_long>_> depth;
  olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *in_stack_ffffffffffffffd0;
  
  depth.value = (value_type)args_5;
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>&>
              ();
  default:
    add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>&>
              ();
  case 1:
    v._M_extent._M_extent_value = (size_t)args_3;
    v._M_ptr = (pointer)(args_2->_M_extent)._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_impl_helpers::
             add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                       ((olc_impl_helpers *)this,
                        (olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)*args,(byte)*(undefined8 *)(args_1->field_0).key_bytes._M_elems,
                        (basic_art_key<unsigned_long>)args_2->_M_ptr,v,
                        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)args_4->value,depth,(read_critical_section *)*args_6,
                        (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)args_7,(read_critical_section *)args_8,in_stack_ffffffffffffffd0);
    break;
  case 2:
    v_00._M_extent._M_extent_value = (size_t)args_3;
    v_00._M_ptr = (pointer)(args_2->_M_extent)._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_impl_helpers::
             add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                       ((olc_impl_helpers *)this,
                        (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)*args,(byte)*(undefined8 *)(args_1->field_0).key_bytes._M_elems,
                        (basic_art_key<unsigned_long>)args_2->_M_ptr,v_00,
                        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)args_4->value,depth,(read_critical_section *)*args_6,
                        (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)args_7,(read_critical_section *)args_8,in_stack_ffffffffffffffd0);
    break;
  case 3:
    v_02._M_extent._M_extent_value = (size_t)args_3;
    v_02._M_ptr = (pointer)(args_2->_M_extent)._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_impl_helpers::
             add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                       ((olc_impl_helpers *)this,
                        (olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)*args,(byte)*(undefined8 *)(args_1->field_0).key_bytes._M_elems,
                        (basic_art_key<unsigned_long>)args_2->_M_ptr,v_02,
                        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)args_4->value,depth,(read_critical_section *)*args_6,
                        (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)args_7,(read_critical_section *)args_8,in_stack_ffffffffffffffd0);
    break;
  case 4:
    v_01._M_extent._M_extent_value = (size_t)args_3;
    v_01._M_ptr = (pointer)(args_2->_M_extent)._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_impl_helpers::
             add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                       ((olc_impl_helpers *)this,
                        (olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)*args,(byte)*(undefined8 *)(args_1->field_0).key_bytes._M_elems,
                        (basic_art_key<unsigned_long>)args_2->_M_ptr,v_01,
                        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)(ulong)args_4->value,depth,(read_critical_section *)*args_6,
                        (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)args_7,(read_critical_section *)args_8,in_stack_ffffffffffffffd0);
  }
  return (_Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
          )(_Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
            )_Var1._M_payload.
             super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] ReturnType add_or_choose_subtree(node_type type,
                                                 Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }